

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O0

void __thiscall
CountOverJoin::CountOverJoin(CountOverJoin *this,string *pathToFiles,shared_ptr<Launcher> *launcher)

{
  string *in_RSI;
  MachineLearningModel *in_RDI;
  Launcher *this_00;
  shared_ptr<Launcher> *in_stack_ffffffffffffffb0;
  
  MachineLearningModel::MachineLearningModel(in_RDI);
  in_RDI->_vptr_MachineLearningModel = (_func_int **)&PTR__CountOverJoin_001f0b98;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  this_00 = (Launcher *)(in_RDI + 5);
  std::shared_ptr<Launcher>::shared_ptr(in_stack_ffffffffffffffb0,(shared_ptr<Launcher> *)this_00);
  std::shared_ptr<FactorisedJoin>::shared_ptr((shared_ptr<FactorisedJoin> *)0x19e345);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x19e35d);
  Launcher::getDTree(this_00);
  in_RDI[0xd]._vptr_MachineLearningModel = (_func_int **)0x0;
  return;
}

Assistant:

CountOverJoin::CountOverJoin(
    const std::string& pathToFiles,std::shared_ptr<Launcher> launcher) : 
    _pathToFiles(pathToFiles), _launcher(launcher), _dTree(launcher->getDTree())
{
}